

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_http_client_async.cpp
# Opt level: O0

void __thiscall Client::HandshakeHandler(Client *this,error_code ec)

{
  bool bVar1;
  ostream *poVar2;
  error_code local_40 [2];
  Client *local_20;
  Client *this_local;
  error_code ec_local;
  
  ec_local._0_8_ = ec.cat_;
  this_local = ec._0_8_;
  local_20 = this;
  bVar1 = boost::system::error_code::operator_cast_to_bool((error_code *)&this_local);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Handshake failed: ");
    boost::system::error_code::message_abi_cxx11_(local_40);
    poVar2 = std::operator<<(poVar2,(string *)local_40);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)local_40);
  }
  else {
    AsyncWrite(this);
  }
  return;
}

Assistant:

void Client::HandshakeHandler(boost::system::error_code ec) {
  if (ec) {
    std::cerr << "Handshake failed: " << ec.message() << std::endl;
  } else {
    AsyncWrite();
  }
}